

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testoverlay.c
# Opt level: O0

void ConvertRGBtoYUY2(SDL_Surface *s,SDL_Overlay *o,int monochrome,int luminance)

{
  bool bVar1;
  Uint8 *local_48;
  Uint8 *op;
  Uint8 *p;
  undefined4 local_30;
  int yuv [3];
  int y;
  int x;
  int luminance_local;
  int monochrome_local;
  SDL_Overlay *o_local;
  SDL_Surface *s_local;
  
  SDL_LockSurface(s);
  SDL_LockYUVOverlay(o);
  yuv[1] = 0;
  while( true ) {
    bVar1 = false;
    if (yuv[1] < s->h) {
      bVar1 = yuv[1] < o->h;
    }
    if (!bVar1) break;
    op = (Uint8 *)((long)s->pixels + (long)(int)((uint)s->pitch * yuv[1]));
    local_48 = *o->pixels + (int)((uint)*o->pitches * yuv[1]);
    yuv[2] = 0;
    while( true ) {
      bVar1 = false;
      if (yuv[2] < s->w) {
        bVar1 = yuv[2] < o->w;
      }
      if (!bVar1) break;
      RGBtoYUV(op,(int *)((long)&p + 4),monochrome,luminance);
      if (yuv[2] % 2 == 0) {
        *local_48 = (Uint8)p._4_4_;
        local_48[1] = (Uint8)local_30;
        local_48[3] = (Uint8)yuv[0];
      }
      else {
        *local_48 = (Uint8)p._4_4_;
      }
      local_48 = local_48 + 2;
      op = op + (int)(uint)s->format->BytesPerPixel;
      yuv[2] = yuv[2] + 1;
    }
    yuv[1] = yuv[1] + 1;
  }
  SDL_UnlockYUVOverlay(o);
  SDL_UnlockSurface(s);
  return;
}

Assistant:

void ConvertRGBtoYUY2(SDL_Surface *s, SDL_Overlay *o, int monochrome, int luminance)
{
	int x,y;
	int yuv[3];
	Uint8 *p,*op;

	SDL_LockSurface(s);
	SDL_LockYUVOverlay(o);

	for(y=0; y<s->h && y<o->h; y++)
	{
		p=((Uint8 *) s->pixels)+s->pitch*y;
		op=o->pixels[0]+o->pitches[0]*y;
		for(x=0; x<s->w && x<o->w; x++)
		{
			RGBtoYUV(p,yuv, monochrome, luminance);
			if(x%2==0)
			{
				*(op++)=yuv[0];
				*(op++)=yuv[1];
				op[1]=yuv[2];
			}
			else
			{
				*op=yuv[0];
				op+=2;
			}

			p+=s->format->BytesPerPixel;
		}
	}

	SDL_UnlockYUVOverlay(o);
	SDL_UnlockSurface(s);
}